

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O2

Amount __thiscall
cfd::CoinSelectionOption::GetConfidentialDustFeeAmount(CoinSelectionOption *this,Address *address)

{
  uint32_t size;
  undefined1 auVar1 [12];
  bool bVar2;
  uint32_t uVar3;
  uint64_t baserate;
  Amount AVar4;
  FeeCalculator dust_fee;
  ConfidentialValue local_260;
  Script locking_script;
  ConfidentialTxOutReference txout;
  ConfidentialTxOut ctxout;
  
  baserate = 3000;
  if (0 < this->dust_fee_rate_) {
    baserate = this->dust_fee_rate_;
  }
  FeeCalculator::FeeCalculator(&dust_fee,baserate);
  core::Address::GetLockingScript(&locking_script,address);
  core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&txout);
  core::ConfidentialValue::ConfidentialValue(&local_260);
  core::ConfidentialTxOut::ConfidentialTxOut
            (&ctxout,&locking_script,(ConfidentialAssetId *)&txout,&local_260);
  core::ConfidentialValue::~ConfidentialValue(&local_260);
  core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&txout);
  core::ConfidentialTxOutReference::ConfidentialTxOutReference(&txout,&ctxout);
  uVar3 = core::ConfidentialTxOutReference::GetSerializeVsize(&txout,true,0,0x34,(uint32_t *)0x0,0);
  bVar2 = core::Script::IsWitnessProgram(&locking_script);
  size = uVar3 + 0x43;
  if (!bVar2) {
    size = uVar3 + 0x94;
  }
  AVar4 = FeeCalculator::GetFee(&dust_fee,size);
  core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&txout);
  core::ConfidentialTxOut::~ConfidentialTxOut(&ctxout);
  core::Script::~Script(&locking_script);
  auVar1 = AVar4._0_12_;
  AVar4._12_4_ = 0;
  AVar4.amount_ = auVar1._0_8_;
  AVar4.ignore_check_ = (bool)auVar1[8];
  AVar4._9_3_ = auVar1._9_3_;
  return AVar4;
}

Assistant:

Amount CoinSelectionOption::GetConfidentialDustFeeAmount(
    const Address& address) const {
  FeeCalculator dust_fee(
      (dust_fee_rate_ <= 0) ? kDustRelayTxFeeRate : dust_fee_rate_);
  Script locking_script = address.GetLockingScript();
  ConfidentialTxOut ctxout(
      locking_script, ConfidentialAssetId(), ConfidentialValue());
  ConfidentialTxOutReference txout(ctxout);
  uint32_t size = txout.GetSerializeVsize(true);

  // Reference: bitcoin/src/policy/policy.cpp : GetDustThreshold()
  if (locking_script.IsWitnessProgram()) {
    // sum the sizes of the parts of a transaction input
    // with 75% segwit discount applied to the script size.
    size += (32 + 4 + 1 + (107 / kWitnessScaleFactor) + 4);
  } else {
    size += (32 + 4 + 1 + 107 + 4);  // the 148 mentioned above
  }
  return dust_fee.GetFee(size);
}